

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maplayers.cpp
# Opt level: O3

void CMapLayers::EnvelopeEval(float TimeOffset,int Env,float *pChannels,void *pUser)

{
  CEnvPoint *pPoints;
  int *piVar1;
  double dVar2;
  long lVar3;
  int *piVar4;
  int NumPoints;
  long lVar5;
  long in_FS_OFFSET;
  float fVar6;
  float fVar7;
  float fVar8;
  double __y;
  int Num;
  int Start;
  int local_40;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pChannels[0] = 0.0;
  pChannels[1] = 0.0;
  pChannels[2] = 0.0;
  pChannels[3] = 0.0;
  if (*(int *)(*(long *)(*(long *)((long)pUser + 8) + 0x858) + 0x10) - 3U < 2) {
    lVar5 = *(long *)((long)pUser + 8) + 0x8b0;
    lVar3 = 0x28;
  }
  else {
    lVar5 = *(long *)((long)pUser + 0x10);
    lVar3 = 0x38;
  }
  lVar3 = *(long *)((long)pUser + lVar3);
  (**(code **)(**(long **)(lVar5 + 0x20) + 0x30))(*(long **)(lVar5 + 0x20),3,&local_3c,&local_40);
  if (Env < local_40) {
    piVar4 = (int *)(**(code **)(**(long **)(lVar5 + 0x20) + 0x28))
                              (*(long **)(lVar5 + 0x20),Env + local_3c,0,0);
    pPoints = (CEnvPoint *)((long)piVar4[2] * 0x58 + lVar3);
    NumPoints = piVar4[3];
    lVar5 = *(long *)(*(long *)((long)pUser + 8) + 0x858);
    if (*(int *)(lVar5 + 0x10) - 3U < 2) {
      piVar1 = *(int **)(*(long *)((long)pUser + 8) + 0xdf8);
      if ((piVar1 != (int *)0x0) && ((*(byte *)(piVar1 + 1) & 0x1c) == 0)) {
        if ((*piVar4 < 2) || (piVar4[0xc] != 0)) {
          fVar8 = ((float)(pPoints[(long)NumPoints + -1].super_CEnvPoint_v1.m_Time -
                          *(int *)(lVar3 + (long)piVar4[2] * 0x58)) / 1000.0) *
                  (float)*(int *)(lVar5 + 0x34);
          __y = (double)fVar8;
          dVar2 = fmod((double)(*(int *)(lVar5 + 0x14) - *piVar1),__y);
          fVar6 = (float)dVar2;
          dVar2 = fmod((double)(*(int *)(*(long *)(*(long *)((long)pUser + 8) + 0x858) + 0x18) -
                               **(int **)(*(long *)((long)pUser + 8) + 0xdf8)),__y);
          fVar7 = (float)dVar2;
          lVar5 = *(long *)(*(long *)((long)pUser + 8) + 0x858);
          EnvelopeEval::s_Time =
               (((float)(~-(uint)(fVar7 < fVar6) & (uint)fVar7 |
                        (uint)(fVar8 + fVar7) & -(uint)(fVar7 < fVar6)) - fVar6) *
                *(float *)(lVar5 + 0x1c) + fVar6) / (float)*(int *)(lVar5 + 0x34);
          NumPoints = piVar4[3];
        }
        else {
          EnvelopeEval::s_Time = *(float *)(lVar5 + 0x2c) - *(float *)((long)pUser + 0x24);
        }
      }
    }
    else {
      EnvelopeEval::s_Time = *(float *)(lVar5 + 0x2c);
    }
    CRenderTools::RenderEvalEnvelope
              (pPoints,NumPoints,4,TimeOffset + EnvelopeEval::s_Time,pChannels);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CMapLayers::EnvelopeEval(float TimeOffset, int Env, float *pChannels, void *pUser)
{
	CMapLayers *pThis = (CMapLayers *)pUser;
	pChannels[0] = 0;
	pChannels[1] = 0;
	pChannels[2] = 0;
	pChannels[3] = 0;

	CEnvPoint *pPoints = 0;
	CLayers *pLayers = 0;
	if(pThis->Client()->State() == IClient::STATE_ONLINE || pThis->Client()->State() == IClient::STATE_DEMOPLAYBACK)
	{
		pLayers = pThis->Layers();
		pPoints = pThis->m_lEnvPoints.base_ptr();
	}
	else
	{
		pLayers = pThis->m_pMenuLayers;
		pPoints = pThis->m_lEnvPointsMenu.base_ptr();
	}

	int Start, Num;
	pLayers->Map()->GetType(MAPITEMTYPE_ENVELOPE, &Start, &Num);

	if(Env >= Num)
		return;

	const CMapItemEnvelope *pItem = (CMapItemEnvelope *)pLayers->Map()->GetItem(Start+Env, 0, 0);
	CEnvPoint *pItemPoints = pPoints + pItem->m_StartPoint;

	static float s_Time = 0.0f;
	float EnvalopTicks = (pItemPoints[pItem->m_NumPoints-1].m_Time - pItemPoints[0].m_Time)/1000.0f * pThis->Client()->GameTickSpeed();
	if(pThis->Client()->State() == IClient::STATE_ONLINE || pThis->Client()->State() == IClient::STATE_DEMOPLAYBACK)
	{
		if(pThis->m_pClient->m_Snap.m_pGameData && !pThis->m_pClient->IsWorldPaused())
		{
			if(pItem->m_Version < 2 || pItem->m_Synchronized)
			{
				float PrevAnimationTick = fmod(pThis->Client()->PrevGameTick() - pThis->m_pClient->m_Snap.m_pGameData->m_GameStartTick, EnvalopTicks);
				float CurAnimationTick = fmod(pThis->Client()->GameTick() - pThis->m_pClient->m_Snap.m_pGameData->m_GameStartTick, EnvalopTicks);
				if(PrevAnimationTick > CurAnimationTick)
					CurAnimationTick += EnvalopTicks;
				s_Time = mix(PrevAnimationTick, CurAnimationTick, pThis->Client()->IntraGameTick()) / pThis->Client()->GameTickSpeed();
			}
			else
				s_Time = pThis->Client()->LocalTime() - pThis->m_OnlineStartTime;
		}
	}
	else
	{
		s_Time = pThis->Client()->LocalTime();
	}
	CRenderTools::RenderEvalEnvelope(pItemPoints, pItem->m_NumPoints, 4, s_Time + TimeOffset, pChannels);
}